

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

int matrix2_equals(matrix2 *self,matrix2 *mT)

{
  short sVar1;
  byte local_21;
  uint8_t i;
  matrix2 *mT_local;
  matrix2 *self_local;
  
  local_21 = 0;
  while( true ) {
    if (3 < local_21) {
      return 1;
    }
    sVar1 = scalar_equalsf((self->field_0).m[local_21],(mT->field_0).m[local_21]);
    if (sVar1 == 0) break;
    local_21 = local_21 + 1;
  }
  return 0;
}

Assistant:

HYPAPI int matrix2_equals(const struct matrix2 *self, const struct matrix2 *mT)
{
	uint8_t i;

	for (i = 0; i < 4; i++) {
		if (scalar_equalsf(self->m[i], mT->m[i]) == 0) {
			return 0;
		}
	}

	return 1;
}